

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd.c
# Opt level: O3

int gdImageColorResolveAlpha(gdImagePtr im,int r,int g,int b,int a)

{
  uint uVar1;
  ulong uVar2;
  long lVar3;
  long lVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  
  if (im->trueColor != 0) {
    return b + a * 0x1000000 + g * 0x100 + r * 0x10000;
  }
  uVar1 = im->colorsTotal;
  if (0 < (int)uVar1) {
    uVar2 = 0xffffffff;
    lVar8 = 0x3f804;
    uVar7 = 0;
    uVar6 = 0xffffffff;
    do {
      if (im->open[uVar7] == 0) {
        if ((uVar7 != (uint)im->transparent) &&
           (lVar3 = (long)im->red[uVar7] - (long)r, lVar9 = (long)im->green[uVar7] - (long)g,
           lVar10 = (long)im->blue[uVar7] - (long)b, lVar4 = (long)im->alpha[uVar7] - (long)a,
           lVar3 = lVar4 * lVar4 + lVar10 * lVar10 + lVar9 * lVar9 + lVar3 * lVar3, lVar3 < lVar8))
        {
          if (lVar3 == 0) {
            return (int)uVar7;
          }
          uVar2 = uVar7 & 0xffffffff;
          lVar8 = lVar3;
        }
      }
      else {
        uVar6 = uVar7 & 0xffffffff;
      }
      uVar7 = uVar7 + 1;
    } while (uVar1 != uVar7);
    uVar5 = (uint)uVar6;
    if ((uint)uVar6 != 0xffffffff) goto LAB_0010b5a0;
    if (uVar1 == 0x100) {
      return (int)uVar2;
    }
  }
  im->colorsTotal = uVar1 + 1;
  uVar5 = uVar1;
LAB_0010b5a0:
  im->red[(int)uVar5] = r;
  im->green[(int)uVar5] = g;
  im->blue[(int)uVar5] = b;
  im->alpha[(int)uVar5] = a;
  im->open[(int)uVar5] = 0;
  return uVar5;
}

Assistant:

BGD_DECLARE(int) gdImageColorResolveAlpha (gdImagePtr im, int r, int g, int b, int a)
{
	int c;
	int ct = -1;
	int op = -1;
	long rd, gd, bd, ad, dist;
	long mindist = 4 * 255 * 255;	/* init to max poss dist */
	if (im->trueColor) {
		return gdTrueColorAlpha (r, g, b, a);
	}

	for (c = 0; c < im->colorsTotal; c++) {
		if (im->open[c]) {
			op = c;		/* Save open slot */
			continue;		/* Color not in use */
		}
		if (c == im->transparent) {
			/* don't ever resolve to the color that has
			 * been designated as the transparent color */
			continue;
		}
		rd = (long) (im->red[c] - r);
		gd = (long) (im->green[c] - g);
		bd = (long) (im->blue[c] - b);
		ad = (long) (im->alpha[c] - a);
		dist = rd * rd + gd * gd + bd * bd + ad * ad;
		if (dist < mindist) {
			if (dist == 0) {
				return c;		/* Return exact match color */
			}
			mindist = dist;
			ct = c;
		}
	}
	/* no exact match.  We now know closest, but first try to allocate exact */
	if (op == -1) {
		op = im->colorsTotal;
		if (op == gdMaxColors) {
			/* No room for more colors */
			return ct;		/* Return closest available color */
		}
		im->colorsTotal++;
	}
	im->red[op] = r;
	im->green[op] = g;
	im->blue[op] = b;
	im->alpha[op] = a;
	im->open[op] = 0;
	return op;			/* Return newly allocated color */
}